

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::BlendTest::createInstance(BlendTest *this,Context *context)

{
  Context **ppCVar1;
  Context **this_00;
  Context **this_01;
  TestInstance *pTVar2;
  undefined8 *puVar3;
  VkFormat VVar4;
  undefined4 uVar5;
  ProgramCollection<vk::ProgramBinary> *pPVar6;
  _func_int **pp_Var7;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  undefined8 uVar8;
  VkAttachmentDescription *pVVar9;
  VkShaderModule VVar10;
  VkResult VVar11;
  TestInstance *pTVar12;
  DeviceInterface *vk;
  VkDevice device;
  InstanceInterface *pIVar13;
  VkPhysicalDevice pVVar14;
  ProgramBinary *pPVar15;
  NotSupportedError *this_02;
  char *__rhs;
  long lVar16;
  size_t __n;
  VkPipelineColorBlendAttachmentState *pVVar17;
  Context *pCVar18;
  TestInstance *pTVar19;
  size_t vertexNdx;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  byte bVar23;
  undefined8 in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff874;
  deUint32 queueFamilyIndex;
  VkRenderPassCreateInfo renderPassParams;
  VkPipelineShaderStageCreateInfo shaderStages [2];
  undefined1 local_658 [16];
  VkDevice local_648;
  VkCommandPool VStack_640;
  VkPipelineColorBlendAttachmentState *local_638;
  float local_630 [4];
  TestInstance *local_620;
  TestInstance *local_618;
  TestInstance *local_610;
  Context **local_608;
  Context **local_600;
  TestInstance *local_5f8;
  Context **local_5f0;
  VkPipelineRasterizationStateCreateInfo rasterStateParams;
  VkAttachmentReference colorAttachmentReference;
  VkAttachmentReference local_5a0;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_578;
  _func_int **local_558;
  Context *pCStack_550;
  VkDevice local_548;
  Context *pCStack_540;
  VkFormatProperties formatProps;
  undefined8 local_518;
  Context *pCStack_510;
  VkPipelineTessellationStateCreateInfo *pVStack_508;
  VkPipelineViewportStateCreateInfo *pVStack_500;
  VkPipelineRasterizationStateCreateInfo *pVStack_4f8;
  VkPipelineMultisampleStateCreateInfo *local_4f0;
  VkPipelineDepthStencilStateCreateInfo *local_4e8;
  VkPipelineColorBlendStateCreateInfo *local_4e0;
  VkPipelineDynamicStateCreateInfo *local_4d8;
  VkPipelineLayout local_4d0;
  VkRenderPass local_4c8;
  deUint32 local_4c0;
  VkPipeline local_4b8;
  deUint32 local_4b0;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkRect2D scissor;
  VkViewport local_310;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkPipelineMultisampleStateCreateInfo multisampleStateParams;
  VkPipelineViewportStateCreateInfo viewportStateParams;
  SimpleAllocator memAlloc;
  
  bVar23 = 0;
  pTVar12 = (TestInstance *)operator_new(0x310);
  VVar4 = this->m_colorFormat;
  pTVar12->m_context = context;
  pTVar12->_vptr_TestInstance = (_func_int **)&PTR__BlendTestInstance_00bcd088;
  pTVar12[9]._vptr_TestInstance = (_func_int **)0x2000000020;
  *(VkFormat *)&pTVar12[9].m_context = VVar4;
  ppCVar1 = &pTVar12[0xf].m_context;
  this_00 = &pTVar12[0x12].m_context;
  local_5f0 = &pTVar12[0x16].m_context;
  local_600 = &pTVar12[0x18].m_context;
  local_608 = &pTVar12[0x1a].m_context;
  this_01 = &pTVar12[0x1c].m_context;
  local_610 = pTVar12 + 0x20;
  local_618 = pTVar12 + 0x2b;
  pTVar2 = pTVar12 + 0x2d;
  local_620 = pTVar12 + 0x2f;
  pTVar12[0x10].m_context = (Context *)0x0;
  pTVar12[0x11]._vptr_TestInstance = (_func_int **)0x0;
  pTVar12[0xf].m_context = (Context *)0x0;
  pTVar12[0x10]._vptr_TestInstance = (_func_int **)0x0;
  pTVar12[0x11].m_context = (Context *)0x0;
  memset(this_00,0,0xe0);
  local_5f8 = pTVar12 + 0x21;
  memset(pTVar12 + 0x21,0,0x100);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(pTVar12->m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(pTVar12->m_context);
  pIVar13 = Context::getInstanceInterface(pTVar12->m_context);
  pVVar14 = Context::getPhysicalDevice(pTVar12->m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&formatProps,pIVar13,pVVar14);
  ::vk::SimpleAllocator::SimpleAllocator
            (&memAlloc,vk,device,(VkPhysicalDeviceMemoryProperties *)&formatProps);
  pVVar17 = this->m_blendStates;
  pTVar19 = pTVar12 + 1;
  for (lVar16 = 0x20; lVar16 != 0; lVar16 = lVar16 + -1) {
    *(VkBool32 *)&pTVar19->_vptr_TestInstance = pVVar17->blendEnable;
    pVVar17 = (VkPipelineColorBlendAttachmentState *)((long)pVVar17 + (ulong)bVar23 * -8 + 4);
    pTVar19 = (TestInstance *)((long)pTVar19 + (ulong)bVar23 * -8 + 4);
  }
  pIVar13 = Context::getInstanceInterface(context);
  pVVar14 = Context::getPhysicalDevice(context);
  (*pIVar13->_vptr_InstanceInterface[3])
            (pIVar13,pVVar14,(ulong)*(uint *)&pTVar12[9].m_context,&formatProps);
  if ((~formatProps.optimalTilingFeatures & 0x180) != 0) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderPassParams,"Unsupported color blending format: ",
               (allocator<char> *)shaderStages);
    __rhs = ::vk::getFormatName(*(VkFormat *)&pTVar12[9].m_context);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&formatProps
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &renderPassParams,__rhs);
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)&formatProps);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar5 = *(undefined4 *)&pTVar12[9].m_context;
  *(undefined4 *)&pTVar12[10]._vptr_TestInstance = 0xe;
  pTVar12[10].m_context = (Context *)0x0;
  pTVar12[0xb]._vptr_TestInstance = (_func_int **)0x100000000;
  *(undefined4 *)&pTVar12[0xb].m_context = uVar5;
  *(_func_int ***)((long)&pTVar12[0xb].m_context + 4) = pTVar12[9]._vptr_TestInstance;
  *(undefined8 *)((long)&pTVar12[0xc]._vptr_TestInstance + 4) = 0x100000001;
  *(undefined8 *)((long)&pTVar12[0xc].m_context + 4) = 0x100000001;
  *(undefined8 *)((long)&pTVar12[0xd]._vptr_TestInstance + 4) = 0x1100000000;
  *(undefined8 *)((long)&pTVar12[0xd].m_context + 4) = 0x100000000;
  pTVar12[0xe].m_context = (Context *)&queueFamilyIndex;
  *(undefined4 *)&pTVar12[0xf]._vptr_TestInstance = 0;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&renderPassParams,vk,device,
                    (VkImageCreateInfo *)(pTVar12 + 10),(VkAllocationCallbacks *)0x0);
  pVVar9 = renderPassParams.pAttachments;
  uVar8 = renderPassParams._16_8_;
  formatProps.linearTilingFeatures = renderPassParams.sType;
  formatProps.optimalTilingFeatures = renderPassParams._4_4_;
  stack0xfffffffffffffad0 = (Context *)renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)ppCVar1);
  pTVar12[0x10].m_context = (Context *)uVar8;
  pTVar12[0x11]._vptr_TestInstance = (_func_int **)pVVar9;
  *ppCVar1 = (Context *)formatProps._0_8_;
  pTVar12[0x10]._vptr_TestInstance = (_func_int **)stack0xfffffffffffffad0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&renderPassParams);
  ::vk::getImageMemoryRequirements((VkMemoryRequirements *)&formatProps,vk,device,(VkImage)*ppCVar1)
  ;
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&renderPassParams,
             &memAlloc,(VkMemoryRequirements *)&formatProps,(MemoryRequirement)0x0);
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  data._8_4_ = in_stack_fffffffffffff870;
  data.ptr = (Allocation *)in_stack_fffffffffffff868;
  data._12_4_ = in_stack_fffffffffffff874;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &pTVar12[0x11].m_context,data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&renderPassParams);
  VVar11 = (*vk->_vptr_DeviceInterface[0xd])
                     (vk,device,*ppCVar1,(pTVar12[0x11].m_context)->m_platformInterface);
  ::vk::checkResult(VVar11,
                    "vk.bindImageMemory(vkDevice, *m_colorImage, m_colorImageAlloc->getMemory(), m_colorImageAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x153);
  formatProps.linearTilingFeatures = 0xf;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_518 = (VkPipelineVertexInputStateCreateInfo *)
              CONCAT44(*(VkMemoryPropertyFlags *)&pTVar12[9].m_context,1);
  pCStack_510 = (Context *)0x0;
  pVStack_508 = (VkPipelineTessellationStateCreateInfo *)0x0;
  pVStack_500 = (VkPipelineViewportStateCreateInfo *)0x1;
  pVStack_4f8 = (VkPipelineRasterizationStateCreateInfo *)0x1;
  local_4f0 = (VkPipelineMultisampleStateCreateInfo *)CONCAT44(local_4f0._4_4_,1);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)shaderStages,vk,device,
             (VkImageViewCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
  renderPassParams.flags = shaderStages[0].flags;
  renderPassParams.attachmentCount = shaderStages[0].stage;
  renderPassParams.pAttachments = (VkAttachmentDescription *)shaderStages[0].module.m_internal;
  renderPassParams.sType = shaderStages[0].sType;
  renderPassParams._4_4_ = shaderStages[0]._4_4_;
  renderPassParams.pNext = shaderStages[0].pNext;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = 0;
  shaderStages[0].module.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)this_00);
  pTVar12[0x13].m_context = (Context *)renderPassParams._16_8_;
  pTVar12[0x14]._vptr_TestInstance = (_func_int **)renderPassParams.pAttachments;
  *this_00 = (Context *)renderPassParams._0_8_;
  pTVar12[0x13]._vptr_TestInstance = (_func_int **)renderPassParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)shaderStages);
  shaderStages[0]._0_8_ = (ulong)*(uint *)&pTVar12[9].m_context << 0x20;
  shaderStages[0].pNext = (void *)0x100000001;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
  shaderStages[0].module.m_internal = 0x200000001;
  shaderStages[0].pName = (char *)CONCAT44(shaderStages[0].pName._4_4_,2);
  local_518 = (VkPipelineVertexInputStateCreateInfo *)&colorAttachmentReference;
  local_5a0 = colorAttachmentReference;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  pCStack_510 = (Context *)0x0;
  pVStack_508 = (VkPipelineTessellationStateCreateInfo *)0x0;
  pVStack_500 = (VkPipelineViewportStateCreateInfo *)0x0;
  formatProps.linearTilingFeatures = 0;
  formatProps.optimalTilingFeatures = 0;
  stack0xfffffffffffffad0 = (Context *)0x0;
  pVStack_4f8 = (VkPipelineRasterizationStateCreateInfo *)0x0;
  renderPassParams.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 1;
  renderPassParams.subpassCount = 1;
  renderPassParams._48_8_ = (ulong)(uint)renderPassParams._52_4_ << 0x20;
  renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)shaderStages;
  renderPassParams.pSubpasses = (VkSubpassDescription *)&formatProps;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)local_658,vk,device,&renderPassParams,
             (VkAllocationCallbacks *)0x0);
  ppCVar1 = local_5f0;
  rasterStateParams._16_8_ = local_648;
  rasterStateParams.rasterizerDiscardEnable = (VkLogicOp)VStack_640.m_internal;
  rasterStateParams.polygonMode = VStack_640.m_internal._4_4_;
  rasterStateParams._0_8_ = local_658._0_8_;
  rasterStateParams.pNext = (void *)local_658._8_8_;
  local_658._0_8_ = 0;
  local_658._8_8_ = (DeviceInterface *)0x0;
  local_648 = (VkDevice)0x0;
  VStack_640.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&pTVar12[0x14].m_context);
  pTVar12[0x15].m_context = (Context *)rasterStateParams._16_8_;
  pTVar12[0x16]._vptr_TestInstance = (_func_int **)rasterStateParams._24_8_;
  pTVar12[0x14].m_context = (Context *)rasterStateParams._0_8_;
  pTVar12[0x15]._vptr_TestInstance = (_func_int **)rasterStateParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_658);
  formatProps.linearTilingFeatures = 0x25;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_518 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(local_518._4_4_,1);
  pVStack_508 = (VkPipelineTessellationStateCreateInfo *)pTVar12[9]._vptr_TestInstance;
  pVStack_500 = (VkPipelineViewportStateCreateInfo *)CONCAT44(pVStack_500._4_4_,1);
  pCStack_510 = (Context *)this_00;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)shaderStages,vk,device,
             (VkFramebufferCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
  renderPassParams.flags = shaderStages[0].flags;
  renderPassParams.attachmentCount = shaderStages[0].stage;
  renderPassParams.pAttachments = (VkAttachmentDescription *)shaderStages[0].module.m_internal;
  renderPassParams.sType = shaderStages[0].sType;
  renderPassParams._4_4_ = shaderStages[0]._4_4_;
  renderPassParams.pNext = shaderStages[0].pNext;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = 0;
  shaderStages[0].module.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)ppCVar1);
  ppCVar1[2] = (Context *)renderPassParams._16_8_;
  ppCVar1[3] = (Context *)renderPassParams.pAttachments;
  *ppCVar1 = (Context *)renderPassParams._0_8_;
  ppCVar1[1] = (Context *)renderPassParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)shaderStages);
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_518 = (VkPipelineVertexInputStateCreateInfo *)0x0;
  pCStack_510 = (Context *)0x0;
  formatProps.linearTilingFeatures = 0x1e;
  formatProps.optimalTilingFeatures = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)shaderStages,vk,device,
             (VkPipelineLayoutCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
  pTVar19 = local_5f8;
  renderPassParams.flags = shaderStages[0].flags;
  renderPassParams.attachmentCount = shaderStages[0].stage;
  renderPassParams.pAttachments = (VkAttachmentDescription *)shaderStages[0].module.m_internal;
  renderPassParams.sType = shaderStages[0].sType;
  renderPassParams._4_4_ = shaderStages[0]._4_4_;
  renderPassParams.pNext = shaderStages[0].pNext;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = 0;
  shaderStages[0].module.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_5f8);
  pTVar19[1]._vptr_TestInstance = (_func_int **)renderPassParams._16_8_;
  pTVar19[1].m_context = (Context *)renderPassParams.pAttachments;
  pTVar19->_vptr_TestInstance = (_func_int **)renderPassParams._0_8_;
  pTVar19->m_context = (Context *)renderPassParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)shaderStages);
  pPVar6 = pTVar12->m_context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)shaderStages,"color_vert",(allocator<char> *)&rasterStateParams);
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar6,(string *)shaderStages);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams,vk,device,pPVar15,0);
  ppCVar1 = local_600;
  pVVar9 = renderPassParams.pAttachments;
  uVar8 = renderPassParams._16_8_;
  formatProps.linearTilingFeatures = renderPassParams.sType;
  formatProps.optimalTilingFeatures = renderPassParams._4_4_;
  stack0xfffffffffffffad0 = (Context *)renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_600);
  ppCVar1[2] = (Context *)uVar8;
  ppCVar1[3] = (Context *)pVVar9;
  *ppCVar1 = (Context *)formatProps._0_8_;
  ppCVar1[1] = stack0xfffffffffffffad0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams);
  std::__cxx11::string::~string((string *)shaderStages);
  pPVar6 = pTVar12->m_context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)shaderStages,"color_frag",(allocator<char> *)&rasterStateParams);
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar6,(string *)shaderStages);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams,vk,device,pPVar15,0);
  ppCVar1 = local_608;
  pVVar9 = renderPassParams.pAttachments;
  uVar8 = renderPassParams._16_8_;
  formatProps.linearTilingFeatures = renderPassParams.sType;
  formatProps.optimalTilingFeatures = renderPassParams._4_4_;
  stack0xfffffffffffffad0 = (Context *)renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_608);
  pTVar19 = pTVar12 + 0x23;
  ppCVar1[2] = (Context *)uVar8;
  ppCVar1[3] = (Context *)pVVar9;
  *ppCVar1 = (Context *)formatProps._0_8_;
  ppCVar1[1] = stack0xfffffffffffffad0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams);
  std::__cxx11::string::~string((string *)shaderStages);
  shaderStages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  shaderStages[0].module.m_internal = (deUint64)pTVar12[0x18].m_context;
  shaderStages[0].pName = "main";
  shaderStages[0].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  shaderStages[1].pNext = (void *)0x0;
  shaderStages[1].flags = 0;
  shaderStages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  shaderStages[1].module.m_internal = (deUint64)pTVar12[0x1a].m_context;
  shaderStages[1].pName = "main";
  shaderStages[1].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  colorAttachmentReference.attachment = 0x13;
  local_5a0 = (VkAttachmentReference)0x0;
  pCStack_510 = (Context *)&inputAssemblyStateParams;
  inputAssemblyStateParams.flags = 0;
  inputAssemblyStateParams.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  inputAssemblyStateParams.primitiveRestartEnable = 0;
  inputAssemblyStateParams._28_4_ = 0;
  inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  inputAssemblyStateParams._4_4_ = 0;
  inputAssemblyStateParams.pNext = (void *)0x0;
  viewportStateParams.pViewports = &local_310;
  local_310.x = 0.0;
  local_310.y = 0.0;
  scissor.extent.width = *(deUint32 *)&pTVar12[9]._vptr_TestInstance;
  local_310.width = (float)scissor.extent.width;
  scissor.extent.height = *(uint *)((long)&pTVar12[9]._vptr_TestInstance + 4);
  local_310.height = (float)scissor.extent.height;
  viewportStateParams.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  local_310.minDepth = 0.0;
  local_310.maxDepth = 1.0;
  pVStack_500 = &viewportStateParams;
  viewportStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportStateParams.pNext = (void *)0x0;
  viewportStateParams.flags = 0;
  viewportStateParams.viewportCount = 1;
  viewportStateParams.scissorCount = 1;
  rasterStateParams.pNext = (void *)0x0;
  rasterStateParams.depthBiasClamp = 0.0;
  rasterStateParams.depthBiasSlopeFactor = 0.0;
  rasterStateParams.cullMode = 0;
  rasterStateParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterStateParams.depthBiasEnable = 0;
  rasterStateParams.depthBiasConstantFactor = 0.0;
  rasterStateParams.flags = 0;
  rasterStateParams.depthClampEnable = 0;
  rasterStateParams.rasterizerDiscardEnable = 0;
  rasterStateParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  rasterStateParams._4_4_ = 0;
  rasterStateParams.lineWidth = 1.0;
  rasterStateParams._60_4_ = 0;
  local_4f0 = &multisampleStateParams;
  multisampleStateParams.pNext = (void *)0x0;
  multisampleStateParams.sampleShadingEnable = 0;
  multisampleStateParams.minSampleShading = 0.0;
  multisampleStateParams.pSampleMask = (VkSampleMask *)0x0;
  multisampleStateParams.alphaToCoverageEnable = 0;
  multisampleStateParams.alphaToOneEnable = 0;
  multisampleStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  multisampleStateParams._4_4_ = 0;
  multisampleStateParams.flags = 0;
  multisampleStateParams.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.dependencyCount = 0;
  renderPassParams._52_4_ = 0;
  renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
  local_658._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_658._8_8_ = (DeviceInterface *)0x0;
  local_648 = (VkDevice)0x0;
  VStack_640.m_internal = 3;
  local_638 = (VkPipelineColorBlendAttachmentState *)0x0;
  formatProps.linearTilingFeatures = 0x1c;
  stack0xfffffffffffffad0 = (Context *)0x0;
  renderPassParams.subpassCount = 0;
  renderPassParams._36_4_ = 0;
  renderPassParams.pSubpasses = (VkSubpassDescription *)0x0;
  local_518 = (VkPipelineVertexInputStateCreateInfo *)&colorAttachmentReference;
  pVStack_508 = (VkPipelineTessellationStateCreateInfo *)0x0;
  pVStack_4f8 = &rasterStateParams;
  local_4e0 = (VkPipelineColorBlendStateCreateInfo *)local_658;
  local_4d8 = (VkPipelineDynamicStateCreateInfo *)0x0;
  renderPassParams.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  renderPassParams._4_4_ = 0;
  local_4d0.m_internal = (deUint64)pTVar12[0x21]._vptr_TestInstance;
  local_4c8.m_internal = (deUint64)pTVar12[0x14].m_context;
  local_4c0 = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)&DAT_100000000;
  local_4b8.m_internal = 0;
  local_4b0 = 0;
  local_630[0] = 0.1;
  local_630[1] = 0.2;
  local_630[2] = 0.3;
  local_630[3] = 0.4;
  lVar16 = 4;
  local_4e8 = (VkPipelineDepthStencilStateCreateInfo *)&renderPassParams;
  while (bVar22 = lVar16 != 0, lVar16 = lVar16 + -1, bVar22) {
    VStack_640.m_internal._4_4_ = 1;
    local_638 = (VkPipelineColorBlendAttachmentState *)(pTVar19 + -0x22);
    ::vk::createGraphicsPipeline
              ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_578,vk,device,(VkPipelineCache)0x0,
               (VkGraphicsPipelineCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
    local_548 = local_578.m_data.deleter.m_device;
    pCStack_540 = (Context *)local_578.m_data.deleter.m_allocator;
    local_558 = (_func_int **)local_578.m_data.object.m_internal;
    pCStack_550 = (Context *)local_578.m_data.deleter.m_deviceIface;
    local_578.m_data.object.m_internal = 0;
    local_578.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_578.m_data.deleter.m_device = (VkDevice)0x0;
    local_578.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
              ((RefBase<vk::Handle<(vk::HandleType)18>_> *)pTVar19);
    pTVar19[1]._vptr_TestInstance = (_func_int **)local_548;
    pTVar19[1].m_context = pCStack_540;
    pTVar19->_vptr_TestInstance = local_558;
    pTVar19->m_context = pCStack_550;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_578);
    pTVar19 = pTVar19 + 2;
  }
  renderPassParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams._16_8_ = renderPassParams._16_8_ & 0xffffffff00000000;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x400;
  renderPassParams.subpassCount = 0x80;
  renderPassParams._36_4_ = 0;
  renderPassParams.pSubpasses =
       (VkSubpassDescription *)CONCAT44(renderPassParams.pSubpasses._4_4_,1);
  renderPassParams._48_8_ = &queueFamilyIndex;
  createOverlappingQuads();
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  _M_move_assign((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
                 &pTVar12[0x1e].m_context,&formatProps);
  std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  ~_Vector_base((_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 *)&formatProps);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)shaderStages,vk,device,
                     (VkBufferCreateInfo *)&renderPassParams,(VkAllocationCallbacks *)0x0);
  VVar10 = shaderStages[0].module;
  uVar8 = shaderStages[0]._16_8_;
  formatProps.linearTilingFeatures = shaderStages[0].sType;
  formatProps.optimalTilingFeatures = shaderStages[0]._4_4_;
  stack0xfffffffffffffad0 = (Context *)shaderStages[0].pNext;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = 0;
  shaderStages[0].module.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)this_01);
  pTVar12[0x1d].m_context = (Context *)uVar8;
  pTVar12[0x1e]._vptr_TestInstance = (_func_int **)VVar10.m_internal;
  *this_01 = (Context *)formatProps._0_8_;
  pTVar12[0x1d]._vptr_TestInstance = (_func_int **)stack0xfffffffffffffad0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)shaderStages);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&formatProps,vk,device,(VkBuffer)*this_01);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)shaderStages,&memAlloc,
             (VkMemoryRequirements *)&formatProps,(MemoryRequirement)0x1);
  pTVar19 = local_610;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  data_00._8_4_ = in_stack_fffffffffffff870;
  data_00.ptr = (Allocation *)in_stack_fffffffffffff868;
  data_00._12_4_ = in_stack_fffffffffffff874;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_610,data_00);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)shaderStages);
  VVar11 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,*this_01,pTVar19->_vptr_TestInstance[1],
                      pTVar19->_vptr_TestInstance[2]);
  ::vk::checkResult(VVar11,
                    "vk.bindBufferMemory(vkDevice, *m_vertexBuffer, m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x29c);
  bVar22 = ::vk::isFloatFormat(*(VkFormat *)&pTVar12[9].m_context);
  if (bVar22) {
    pCVar18 = pTVar12[0x1e].m_context;
    __n = (long)pTVar12[0x1f]._vptr_TestInstance - (long)pCVar18;
  }
  else {
    shaderStages[0]._0_8_ = ::vk::mapVkFormat(*(VkFormat *)&pTVar12[9].m_context);
    tcu::getTextureFormatInfo((TextureFormatInfo *)&formatProps,(TextureFormat *)shaderStages);
    lVar16 = 0x10;
    uVar20 = 0;
    while( true ) {
      pCVar18 = pTVar12[0x1e].m_context;
      __n = (long)pTVar12[0x1f]._vptr_TestInstance - (long)pCVar18;
      if ((ulong)((long)__n >> 5) <= uVar20) break;
      tcu::operator-((tcu *)&rasterStateParams,
                     (Vector<float,_4> *)((long)&pCVar18->m_testCtx + lVar16),
                     (Vector<float,_4> *)&pVStack_508);
      tcu::operator/((tcu *)shaderStages,(Vector<float,_4> *)&rasterStateParams,
                     (Vector<float,_4> *)&local_518);
      puVar3 = (undefined8 *)((long)&(pTVar12[0x1e].m_context)->m_testCtx + lVar16);
      *puVar3 = shaderStages[0]._0_8_;
      puVar3[1] = shaderStages[0].pNext;
      uVar20 = uVar20 + 1;
      lVar16 = lVar16 + 0x20;
    }
  }
  memcpy(pTVar12[0x20]._vptr_TestInstance[3],pCVar18,__n);
  formatProps.linearTilingFeatures = 6;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_518 = (VkPipelineVertexInputStateCreateInfo *)renderPassParams.pAttachments;
  (*vk->_vptr_DeviceInterface[9])(vk,device,1,&formatProps);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&renderPassParams,vk,device,1,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  pTVar19 = local_618;
  pVVar9 = renderPassParams.pAttachments;
  uVar8 = renderPassParams._16_8_;
  formatProps.linearTilingFeatures = renderPassParams.sType;
  formatProps.optimalTilingFeatures = renderPassParams._4_4_;
  stack0xfffffffffffffad0 = (Context *)renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_618);
  pTVar19[1]._vptr_TestInstance = (_func_int **)uVar8;
  pTVar19[1].m_context = (Context *)pVVar9;
  pTVar19->_vptr_TestInstance = (_func_int **)formatProps._0_8_;
  pTVar19->m_context = stack0xfffffffffffffad0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&renderPassParams);
  rasterStateParams.flags = 0;
  rasterStateParams.depthClampEnable = 0;
  rasterStateParams.rasterizerDiscardEnable = 0;
  rasterStateParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterStateParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  rasterStateParams._4_4_ = 0;
  rasterStateParams.pNext = (void *)0x0;
  _colorAttachmentReference = defaultClearValue(*(VkFormat *)&pTVar12[9].m_context);
  renderPassParams.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams._16_8_ = pTVar12[0x14].m_context;
  renderPassParams.pAttachments = (VkAttachmentDescription *)pTVar12[0x16].m_context;
  renderPassParams.subpassCount = 0;
  renderPassParams._36_4_ = 0;
  renderPassParams.pSubpasses = (VkSubpassDescription *)pTVar12[9]._vptr_TestInstance;
  formatProps.linearTilingFeatures = 0x2d;
  stack0xfffffffffffffad0 = (Context *)0x0;
  renderPassParams.dependencyCount = 1;
  renderPassParams.pDependencies = (VkSubpassDependency *)&colorAttachmentReference;
  local_518 = (VkPipelineVertexInputStateCreateInfo *)0xffffffffffffffff;
  pCStack_510 = pTVar12[0xf].m_context;
  pVStack_508 = (VkPipelineTessellationStateCreateInfo *)0x1;
  pVStack_500 = (VkPipelineViewportStateCreateInfo *)0x1;
  pVStack_4f8 = (VkPipelineRasterizationStateCreateInfo *)CONCAT44(pVStack_4f8._4_4_,1);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_658,vk,device,
             (VkCommandPool)pTVar12[0x2b]._vptr_TestInstance,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  shaderStages[0]._16_8_ = local_648;
  shaderStages[0].module.m_internal = VStack_640.m_internal;
  shaderStages[0]._0_8_ = local_658._0_8_;
  shaderStages[0].pNext = (void *)local_658._8_8_;
  local_658._0_8_ = 0;
  local_658._8_8_ = (DeviceInterface *)0x0;
  local_648 = (VkDevice)0x0;
  VStack_640.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            ((RefBase<vk::VkCommandBuffer_s_*> *)pTVar2);
  pTVar12[0x2e]._vptr_TestInstance = (_func_int **)shaderStages[0]._16_8_;
  pTVar12[0x2e].m_context = (Context *)shaderStages[0].module.m_internal;
  ((RefData<vk::VkCommandBuffer_s_*> *)&pTVar2->_vptr_TestInstance)->object =
       (VkCommandBuffer_s *)shaderStages[0]._0_8_;
  pTVar12[0x2d].m_context = (Context *)shaderStages[0].pNext;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_658);
  VVar11 = (*vk->_vptr_DeviceInterface[0x49])
                     (vk,((RefData<vk::VkCommandBuffer_s_*> *)&pTVar2->_vptr_TestInstance)->object,
                      &rasterStateParams);
  ::vk::checkResult(VVar11,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x2e0);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,((RefData<vk::VkCommandBuffer_s_*> *)&pTVar2->_vptr_TestInstance)->object,1,0x80,0,0
             ,0,0,0,1,&formatProps);
  (*vk->_vptr_DeviceInterface[0x74])
            (vk,((RefData<vk::VkCommandBuffer_s_*> *)&pTVar2->_vptr_TestInstance)->object,
             &renderPassParams,0);
  pp_Var7 = pTVar12[0x1f]._vptr_TestInstance;
  pCVar18 = pTVar12[0x1e].m_context;
  lVar21 = 0;
  for (lVar16 = 0x230; lVar16 != 0x2b0; lVar16 = lVar16 + 0x20) {
    shaderStages[0]._0_8_ = lVar21;
    (*vk->_vptr_DeviceInterface[0x4c])
              (vk,pTVar12[0x2d]._vptr_TestInstance,0,
               *(undefined8 *)((long)&pTVar12->_vptr_TestInstance + lVar16));
    (*vk->_vptr_DeviceInterface[0x58])
              (vk,((RefData<vk::VkCommandBuffer_s_*> *)&pTVar2->_vptr_TestInstance)->object,0,1,
               this_01,shaderStages);
    (*vk->_vptr_DeviceInterface[0x59])
              (vk,pTVar12[0x2d]._vptr_TestInstance,
               (ulong)((long)pTVar12[0x1f]._vptr_TestInstance - (long)pTVar12[0x1e].m_context) >> 7,
               1,0,0);
    lVar21 = lVar21 + ((long)pp_Var7 - (long)pCVar18 >> 2 & 0xffffffffffffffe0U);
  }
  (*vk->_vptr_DeviceInterface[0x76])
            (vk,((RefData<vk::VkCommandBuffer_s_*> *)&pTVar2->_vptr_TestInstance)->object);
  VVar11 = (*vk->_vptr_DeviceInterface[0x4a])
                     (vk,((RefData<vk::VkCommandBuffer_s_*> *)&pTVar2->_vptr_TestInstance)->object);
  ::vk::checkResult(VVar11,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x2f3);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&renderPassParams,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  pTVar2 = local_620;
  pVVar9 = renderPassParams.pAttachments;
  uVar8 = renderPassParams._16_8_;
  formatProps.linearTilingFeatures = renderPassParams.sType;
  formatProps.optimalTilingFeatures = renderPassParams._4_4_;
  stack0xfffffffffffffad0 = (Context *)renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_620);
  pTVar2[1]._vptr_TestInstance = (_func_int **)uVar8;
  pTVar2[1].m_context = (Context *)pVVar9;
  pTVar2->_vptr_TestInstance = (_func_int **)formatProps._0_8_;
  pTVar2->m_context = stack0xfffffffffffffad0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&renderPassParams);
  return pTVar12;
}

Assistant:

TestInstance* BlendTest::createInstance(Context& context) const
{
	return new BlendTestInstance(context, m_colorFormat, m_blendStates);
}